

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_object.cpp
# Opt level: O2

string __thiscall
mjs::anon_unknown_110::array_join(anon_unknown_110 *this,object_ptr *o,wstring_view *sep)

{
  gc_heap *h;
  uint32_t uVar1;
  undefined8 *puVar2;
  uint32_t index;
  undefined8 extraout_RDX;
  uint uVar3;
  string sVar4;
  wstring s;
  undefined1 local_a8 [16];
  gc_heap *local_98;
  wchar_t *local_90;
  undefined4 local_88;
  wstring_view local_78;
  value local_58;
  
  h = (o->super_gc_heap_ptr_untyped).heap_;
  puVar2 = (undefined8 *)gc_heap_ptr_untyped::get(&o->super_gc_heap_ptr_untyped);
  local_98 = (gc_heap *)0x6;
  local_90 = L"length";
  (**(code **)*puVar2)(&local_58,puVar2);
  uVar1 = to_uint32(&local_58);
  value::~value(&local_58);
  local_98 = (gc_heap *)&local_88;
  local_90 = (wchar_t *)0x0;
  local_88 = 0;
  for (uVar3 = 0; uVar1 != uVar3; uVar3 = uVar3 + 1) {
    if (uVar3 != 0) {
      std::__cxx11::wstring::append<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>>
                ((wstring *)&local_98,sep);
    }
    puVar2 = (undefined8 *)gc_heap_ptr_untyped::get(&o->super_gc_heap_ptr_untyped);
    index_string_abi_cxx11_((wstring *)&local_78,(mjs *)(ulong)uVar3,index);
    local_a8._0_8_ = local_78._M_str;
    local_a8._8_8_ = local_78._M_len;
    (**(code **)*puVar2)(&local_58,puVar2,(gc_heap_ptr_untyped *)local_a8);
    std::__cxx11::wstring::~wstring((wstring *)&local_78);
    if (null < local_58.type_) {
      to_string((mjs *)local_a8,h,&local_58);
      local_78 = string::view((string *)local_a8);
      std::__cxx11::wstring::append<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>>
                ((wstring *)&local_98,
                 (basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&local_78);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_a8);
    }
    value::~value(&local_58);
  }
  local_58._0_8_ = local_90;
  local_58.field_1.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ = local_98;
  string::string((string *)this,h,(wstring_view *)&local_58);
  std::__cxx11::wstring::~wstring((wstring *)&local_98);
  sVar4.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped._8_8_ = extraout_RDX;
  sVar4.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
  return (string)sVar4.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped;
}

Assistant:

string array_join(const object_ptr& o, const std::wstring_view& sep) {
    auto& h = o.heap();
    const uint32_t l = to_uint32(o->get(L"length"));
    std::wstring s;
    for (uint32_t i = 0; i < l; ++i) {
        if (i) s += sep;
        const auto& oi = o->get(index_string(i));
        if (oi.type() != value_type::undefined && oi.type() != value_type::null) {
            s += to_string(h, oi).view();
        }
    }
    return string{h, s};
}